

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O1

void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  void **ppvVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  if (vInfo->nSize < 2) {
LAB_0065440f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar1 = vInfo->pArray;
  if ((pCex != (Abc_Cex_t *)0x0) && (pAig->nRegs != pCex->nRegs)) {
    __assert_fail("pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x6d,"void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)"
                 );
  }
  if (vInfo->nSize < pAig->nRegs) {
    __assert_fail("Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x6e,"void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)"
                 );
  }
  uVar7 = (uint)((ulong)((long)ppvVar1[1] - (long)*ppvVar1) >> 2);
  if (pAig->nRegs < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if ((long)vInfo->nSize <= (long)uVar4) goto LAB_0065440f;
      if (0 < (int)uVar7) {
        pvVar2 = ppvVar1[uVar4];
        uVar6 = 0;
        do {
          if (pCex == (Abc_Cex_t *)0x0) {
            iVar5 = 0;
          }
          else {
            iVar5 = -(uint)(((uint)(&pCex[1].iPo)[uVar4 >> 5 & 0x7ffffff] >> ((uint)uVar4 & 0x1f) &
                            1) != 0);
          }
          *(int *)((long)pvVar2 + uVar6 * 4) = iVar5;
          uVar6 = uVar6 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar6);
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)pAig->nRegs);
  }
  if ((int)uVar4 < vInfo->nSize) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      if (0 < (int)uVar7) {
        pvVar2 = vInfo->pArray[uVar4];
        uVar6 = 0;
        do {
          uVar3 = Gia_ManRandom(0);
          *(uint *)((long)pvVar2 + uVar6 * 4) = uVar3;
          uVar6 = uVar6 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar6);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < vInfo->nSize);
  }
  return;
}

Assistant:

void Cec_ManSeqDeriveInfoInitRandom( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs );
    assert( Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = (pCex && Abc_InfoHasBit(pCex->pData, k))? ~0 : 0;
    }

    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}